

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateBuilder
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  undefined1 local_88 [8];
  MessageBuilderLiteGenerator builderGenerator;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "public static Builder newBuilder() {\n  return DEFAULT_INSTANCE.toBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n}\n\n"
                     ,"classname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
            ((MessageBuilderLiteGenerator *)local_88,(this->super_MessageGenerator).descriptor_,
             this->context_);
  MessageBuilderLiteGenerator::Generate((MessageBuilderLiteGenerator *)local_88,local_18);
  MessageBuilderLiteGenerator::~MessageBuilderLiteGenerator((MessageBuilderLiteGenerator *)local_88)
  ;
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
    "public static Builder newBuilder() {\n"
    "  return DEFAULT_INSTANCE.toBuilder();\n"
    "}\n"
    "public static Builder newBuilder($classname$ prototype) {\n"
    "  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  MessageBuilderLiteGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}